

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  AABBNodeMB4D *node1;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  UVIdentity<4> mapUV;
  NodeRef *local_15f8;
  NodeRef *local_15f0;
  undefined1 local_1528 [16];
  undefined1 (*local_1510) [16];
  ulong local_1508;
  long local_1500;
  long local_14f8;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  UVIdentity<4> *local_1448;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_15f0 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_11f8._4_4_ = uVar2;
  local_11f8._0_4_ = uVar2;
  local_11f8._8_4_ = uVar2;
  local_11f8._12_4_ = uVar2;
  local_11f8._16_4_ = uVar2;
  local_11f8._20_4_ = uVar2;
  local_11f8._24_4_ = uVar2;
  local_11f8._28_4_ = uVar2;
  auVar73 = ZEXT3264(local_11f8);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = uVar2;
  local_1218._0_4_ = uVar2;
  local_1218._8_4_ = uVar2;
  local_1218._12_4_ = uVar2;
  local_1218._16_4_ = uVar2;
  local_1218._20_4_ = uVar2;
  local_1218._24_4_ = uVar2;
  local_1218._28_4_ = uVar2;
  auVar80 = ZEXT3264(local_1218);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = uVar2;
  local_1238._0_4_ = uVar2;
  local_1238._8_4_ = uVar2;
  local_1238._12_4_ = uVar2;
  local_1238._16_4_ = uVar2;
  local_1238._20_4_ = uVar2;
  local_1238._24_4_ = uVar2;
  local_1238._28_4_ = uVar2;
  auVar85 = ZEXT3264(local_1238);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar112 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar86 = fVar104 * 0.99999964;
  fVar91 = fVar112 * 0.99999964;
  fVar97 = fVar120 * 0.99999964;
  fVar104 = fVar104 * 1.0000004;
  fVar112 = fVar112 * 1.0000004;
  fVar120 = fVar120 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = uVar27 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1318._4_4_ = iVar3;
  local_1318._0_4_ = iVar3;
  local_1318._8_4_ = iVar3;
  local_1318._12_4_ = iVar3;
  local_1318._16_4_ = iVar3;
  local_1318._20_4_ = iVar3;
  local_1318._24_4_ = iVar3;
  local_1318._28_4_ = iVar3;
  auVar134 = ZEXT3264(local_1318);
  iVar3 = (tray->tfar).field_0.i[k];
  local_1338._4_4_ = iVar3;
  local_1338._0_4_ = iVar3;
  local_1338._8_4_ = iVar3;
  local_1338._12_4_ = iVar3;
  local_1338._16_4_ = iVar3;
  local_1338._20_4_ = iVar3;
  local_1338._24_4_ = iVar3;
  local_1338._28_4_ = iVar3;
  auVar139 = ZEXT3264(local_1338);
  local_1510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1258 = fVar86;
  fStack_1254 = fVar86;
  fStack_1250 = fVar86;
  fStack_124c = fVar86;
  fStack_1248 = fVar86;
  fStack_1244 = fVar86;
  fStack_1240 = fVar86;
  fStack_123c = fVar86;
  local_1278 = fVar91;
  fStack_1274 = fVar91;
  fStack_1270 = fVar91;
  fStack_126c = fVar91;
  fStack_1268 = fVar91;
  fStack_1264 = fVar91;
  fStack_1260 = fVar91;
  fStack_125c = fVar91;
  local_1298 = fVar97;
  fStack_1294 = fVar97;
  fStack_1290 = fVar97;
  fStack_128c = fVar97;
  fStack_1288 = fVar97;
  fStack_1284 = fVar97;
  fStack_1280 = fVar97;
  fStack_127c = fVar97;
  local_12b8 = fVar104;
  fStack_12b4 = fVar104;
  fStack_12b0 = fVar104;
  fStack_12ac = fVar104;
  fStack_12a8 = fVar104;
  fStack_12a4 = fVar104;
  fStack_12a0 = fVar104;
  fStack_129c = fVar104;
  local_12d8 = fVar112;
  fStack_12d4 = fVar112;
  fStack_12d0 = fVar112;
  fStack_12cc = fVar112;
  fStack_12c8 = fVar112;
  fStack_12c4 = fVar112;
  fStack_12c0 = fVar112;
  fStack_12bc = fVar112;
  local_12f8 = fVar120;
  fStack_12f4 = fVar120;
  fStack_12f0 = fVar120;
  fStack_12ec = fVar120;
  fStack_12e8 = fVar120;
  fStack_12e4 = fVar120;
  fStack_12e0 = fVar120;
  fStack_12dc = fVar120;
  fVar88 = fVar86;
  fVar89 = fVar86;
  fVar90 = fVar86;
  fVar121 = fVar86;
  fVar125 = fVar86;
  fVar127 = fVar86;
  fVar129 = fVar91;
  fVar133 = fVar91;
  fVar135 = fVar91;
  fVar136 = fVar91;
  fVar137 = fVar91;
  fVar96 = fVar91;
  fVar98 = fVar97;
  fVar99 = fVar97;
  fVar100 = fVar97;
  fVar101 = fVar97;
  fVar102 = fVar97;
  fVar103 = fVar97;
  fVar106 = fVar104;
  fVar107 = fVar104;
  fVar108 = fVar104;
  fVar109 = fVar104;
  fVar110 = fVar104;
  fVar111 = fVar104;
  fVar114 = fVar112;
  fVar115 = fVar112;
  fVar116 = fVar112;
  fVar117 = fVar112;
  fVar118 = fVar112;
  fVar119 = fVar112;
  fVar124 = fVar120;
  fVar126 = fVar120;
  fVar128 = fVar120;
  fVar130 = fVar120;
  fVar131 = fVar120;
  fVar132 = fVar120;
  local_1508 = uVar27;
  do {
    if (local_15f0 == stack) {
LAB_016681a3:
      return local_15f0 != stack;
    }
    local_15f8 = local_15f0 + -1;
    sVar33 = local_15f0[-1].ptr;
    while ((sVar33 & 8) == 0) {
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar41._4_4_ = uVar2;
      auVar41._0_4_ = uVar2;
      auVar41._8_4_ = uVar2;
      auVar41._12_4_ = uVar2;
      auVar41._16_4_ = uVar2;
      auVar41._20_4_ = uVar2;
      auVar41._24_4_ = uVar2;
      auVar41._28_4_ = uVar2;
      uVar16 = sVar33 & 0xfffffffffffffff0;
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar27),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar27));
      auVar7 = vsubps_avx(ZEXT1632(auVar64),auVar73._0_32_);
      auVar8._4_4_ = fVar88 * auVar7._4_4_;
      auVar8._0_4_ = fVar86 * auVar7._0_4_;
      auVar8._8_4_ = fVar89 * auVar7._8_4_;
      auVar8._12_4_ = fVar90 * auVar7._12_4_;
      auVar8._16_4_ = fVar121 * auVar7._16_4_;
      auVar8._20_4_ = fVar125 * auVar7._20_4_;
      auVar8._24_4_ = fVar127 * auVar7._24_4_;
      auVar8._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar134._0_32_,auVar8);
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar21),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar21));
      auVar8 = vsubps_avx(ZEXT1632(auVar64),auVar80._0_32_);
      auVar9._4_4_ = fVar129 * auVar8._4_4_;
      auVar9._0_4_ = fVar91 * auVar8._0_4_;
      auVar9._8_4_ = fVar133 * auVar8._8_4_;
      auVar9._12_4_ = fVar135 * auVar8._12_4_;
      auVar9._16_4_ = fVar136 * auVar8._16_4_;
      auVar9._20_4_ = fVar137 * auVar8._20_4_;
      auVar9._24_4_ = fVar96 * auVar8._24_4_;
      auVar9._28_4_ = auVar8._28_4_;
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar34),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar34));
      auVar8 = vsubps_avx(ZEXT1632(auVar64),auVar85._0_32_);
      auVar12._4_4_ = fVar98 * auVar8._4_4_;
      auVar12._0_4_ = fVar97 * auVar8._0_4_;
      auVar12._8_4_ = fVar99 * auVar8._8_4_;
      auVar12._12_4_ = fVar100 * auVar8._12_4_;
      auVar12._16_4_ = fVar101 * auVar8._16_4_;
      auVar12._20_4_ = fVar102 * auVar8._20_4_;
      auVar12._24_4_ = fVar103 * auVar8._24_4_;
      auVar12._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar9,auVar12);
      auVar7 = vmaxps_avx(auVar7,auVar8);
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar22),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar22));
      auVar8 = vsubps_avx(ZEXT1632(auVar64),auVar73._0_32_);
      auVar13._4_4_ = fVar106 * auVar8._4_4_;
      auVar13._0_4_ = fVar104 * auVar8._0_4_;
      auVar13._8_4_ = fVar107 * auVar8._8_4_;
      auVar13._12_4_ = fVar108 * auVar8._12_4_;
      auVar13._16_4_ = fVar109 * auVar8._16_4_;
      auVar13._20_4_ = fVar110 * auVar8._20_4_;
      auVar13._24_4_ = fVar111 * auVar8._24_4_;
      auVar13._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar139._0_32_,auVar13);
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar21 ^ 0x20)),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar21 ^ 0x20)));
      auVar9 = vsubps_avx(ZEXT1632(auVar64),auVar80._0_32_);
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar34 ^ 0x20)),auVar41,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar34 ^ 0x20)));
      auVar14._4_4_ = fVar114 * auVar9._4_4_;
      auVar14._0_4_ = fVar112 * auVar9._0_4_;
      auVar14._8_4_ = fVar115 * auVar9._8_4_;
      auVar14._12_4_ = fVar116 * auVar9._12_4_;
      auVar14._16_4_ = fVar117 * auVar9._16_4_;
      auVar14._20_4_ = fVar118 * auVar9._20_4_;
      auVar14._24_4_ = fVar119 * auVar9._24_4_;
      auVar14._28_4_ = auVar9._28_4_;
      auVar9 = vsubps_avx(ZEXT1632(auVar64),auVar85._0_32_);
      auVar15._4_4_ = fVar124 * auVar9._4_4_;
      auVar15._0_4_ = fVar120 * auVar9._0_4_;
      auVar15._8_4_ = fVar126 * auVar9._8_4_;
      auVar15._12_4_ = fVar128 * auVar9._12_4_;
      auVar15._16_4_ = fVar130 * auVar9._16_4_;
      auVar15._20_4_ = fVar131 * auVar9._20_4_;
      auVar15._24_4_ = fVar132 * auVar9._24_4_;
      auVar15._28_4_ = auVar9._28_4_;
      auVar9 = vminps_avx(auVar14,auVar15);
      auVar8 = vminps_avx(auVar8,auVar9);
      auVar7 = vcmpps_avx(auVar7,auVar8,2);
      if (((uint)sVar33 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar16 + 0x1c0),auVar41,2);
        auVar9 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar9);
        auVar7 = vandps_avx(auVar8,auVar7);
        auVar64 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      else {
        auVar64 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      auVar35 = vpsllw_avx(auVar64,0xf);
      auVar64 = vpacksswb_avx(auVar35,auVar35);
      bVar10 = SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar64 >> 0x17,0) & 1) << 2 | (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar64 >> 0x27,0) & 1) << 4 | (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7;
      if ((((((((auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar35[0xf])
      goto LAB_01668178;
      lVar11 = 0;
      for (uVar18 = (ulong)bVar10; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      sVar33 = *(size_t *)(uVar16 + lVar11 * 8);
      uVar17 = bVar10 - 1 & (uint)bVar10;
      uVar18 = (ulong)uVar17;
      if (uVar17 != 0) {
        do {
          local_15f8->ptr = sVar33;
          local_15f8 = local_15f8 + 1;
          lVar11 = 0;
          for (uVar20 = uVar18; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          sVar33 = *(size_t *)(uVar16 + lVar11 * 8);
        } while (uVar18 != 0);
      }
    }
    local_14f8 = (ulong)((uint)sVar33 & 0xf) - 8;
    uVar16 = sVar33 & 0xfffffffffffffff0;
    for (local_1500 = 0; local_1500 != local_14f8; local_1500 = local_1500 + 1) {
      lVar24 = local_1500 * 0x50;
      scene = context->scene;
      pGVar5 = (scene->geometries).items[*(uint *)(uVar16 + 0x30 + lVar24)].ptr;
      fVar104 = (pGVar5->time_range).lower;
      fVar104 = pGVar5->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar104) / ((pGVar5->time_range).upper - fVar104)
                );
      auVar64 = vroundss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),9);
      auVar64 = vminss_avx(auVar64,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
      auVar62 = vmaxss_avx(ZEXT816(0),auVar64);
      lVar19 = (long)(int)auVar62._0_4_ * 0x38;
      uVar25 = (ulong)*(uint *)(uVar16 + 4 + lVar24);
      lVar11 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar19);
      lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar19);
      auVar64 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar16 + lVar24) * 4);
      uVar20 = (ulong)*(uint *)(uVar16 + 0x10 + lVar24);
      auVar35 = *(undefined1 (*) [16])(lVar11 + uVar20 * 4);
      uVar28 = (ulong)*(uint *)(uVar16 + 0x20 + lVar24);
      auVar38 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
      auVar50 = *(undefined1 (*) [16])(lVar11 + uVar25 * 4);
      uVar29 = (ulong)*(uint *)(uVar16 + 0x14 + lVar24);
      auVar42 = *(undefined1 (*) [16])(lVar11 + uVar29 * 4);
      uVar30 = (ulong)*(uint *)(uVar16 + 0x24 + lVar24);
      auVar43 = *(undefined1 (*) [16])(lVar11 + uVar30 * 4);
      uVar23 = (ulong)*(uint *)(uVar16 + 8 + lVar24);
      auVar48 = *(undefined1 (*) [16])(lVar11 + uVar23 * 4);
      uVar27 = (ulong)*(uint *)(uVar16 + 0x18 + lVar24);
      auVar51 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
      uVar31 = (ulong)*(uint *)(uVar16 + 0x28 + lVar24);
      auVar59 = *(undefined1 (*) [16])(lVar11 + uVar31 * 4);
      uVar26 = (ulong)*(uint *)(uVar16 + 0xc + lVar24);
      auVar60 = *(undefined1 (*) [16])(lVar11 + uVar26 * 4);
      uVar32 = (ulong)*(uint *)(uVar16 + 0x1c + lVar24);
      auVar45 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
      uVar18 = (ulong)*(uint *)(uVar16 + 0x2c + lVar24);
      auVar72 = *(undefined1 (*) [16])(lVar11 + uVar18 * 4);
      auVar79 = *(undefined1 (*) [16])(lVar19 + (ulong)*(uint *)(uVar16 + lVar24) * 4);
      auVar87 = *(undefined1 (*) [16])(lVar19 + uVar20 * 4);
      fVar104 = fVar104 - auVar62._0_4_;
      auVar62 = vunpcklps_avx(auVar64,auVar48);
      auVar48 = vunpckhps_avx(auVar64,auVar48);
      auVar56 = vunpcklps_avx(auVar50,auVar60);
      auVar50 = vunpckhps_avx(auVar50,auVar60);
      auVar64 = *(undefined1 (*) [16])(lVar19 + uVar25 * 4);
      auVar36 = vunpcklps_avx(auVar48,auVar50);
      auVar37 = vunpcklps_avx(auVar62,auVar56);
      auVar48 = vunpckhps_avx(auVar62,auVar56);
      auVar60 = vunpcklps_avx(auVar35,auVar51);
      auVar50 = vunpckhps_avx(auVar35,auVar51);
      auVar51 = vunpcklps_avx(auVar42,auVar45);
      auVar42 = vunpckhps_avx(auVar42,auVar45);
      auVar35 = *(undefined1 (*) [16])(lVar19 + uVar23 * 4);
      auVar45 = vunpcklps_avx(auVar50,auVar42);
      auVar62 = vunpcklps_avx(auVar60,auVar51);
      auVar42 = vunpckhps_avx(auVar60,auVar51);
      auVar60 = vunpcklps_avx(auVar38,auVar59);
      auVar51 = vunpckhps_avx(auVar38,auVar59);
      auVar56 = vunpcklps_avx(auVar43,auVar72);
      auVar59 = vunpckhps_avx(auVar43,auVar72);
      auVar50 = *(undefined1 (*) [16])(lVar19 + uVar26 * 4);
      auVar72 = vunpcklps_avx(auVar51,auVar59);
      auVar38 = vunpcklps_avx(auVar60,auVar56);
      auVar51 = vunpckhps_avx(auVar60,auVar56);
      auVar59 = vunpcklps_avx(auVar79,auVar35);
      auVar35 = vunpckhps_avx(auVar79,auVar35);
      auVar60 = vunpcklps_avx(auVar64,auVar50);
      auVar50 = vunpckhps_avx(auVar64,auVar50);
      auVar64 = *(undefined1 (*) [16])(lVar19 + uVar27 * 4);
      auVar79 = vunpcklps_avx(auVar35,auVar50);
      auVar56 = vunpcklps_avx(auVar59,auVar60);
      auVar50 = vunpckhps_avx(auVar59,auVar60);
      auVar60 = vunpcklps_avx(auVar87,auVar64);
      auVar59 = vunpckhps_avx(auVar87,auVar64);
      auVar64 = *(undefined1 (*) [16])(lVar19 + uVar29 * 4);
      auVar35 = *(undefined1 (*) [16])(lVar19 + uVar32 * 4);
      auVar87 = vunpcklps_avx(auVar64,auVar35);
      auVar64 = vunpckhps_avx(auVar64,auVar35);
      auVar43 = vunpcklps_avx(auVar59,auVar64);
      auVar44 = vunpcklps_avx(auVar60,auVar87);
      auVar59 = vunpckhps_avx(auVar60,auVar87);
      auVar64 = *(undefined1 (*) [16])(lVar19 + uVar28 * 4);
      auVar35 = *(undefined1 (*) [16])(lVar19 + uVar31 * 4);
      auVar87 = vunpcklps_avx(auVar64,auVar35);
      auVar60 = vunpckhps_avx(auVar64,auVar35);
      auVar64 = *(undefined1 (*) [16])(lVar19 + uVar30 * 4);
      auVar35 = *(undefined1 (*) [16])(lVar19 + uVar18 * 4);
      auVar49 = vunpcklps_avx(auVar64,auVar35);
      auVar64 = vunpckhps_avx(auVar64,auVar35);
      auVar35 = vunpcklps_avx(auVar60,auVar64);
      auVar60 = vunpcklps_avx(auVar87,auVar49);
      auVar64 = vunpckhps_avx(auVar87,auVar49);
      fVar112 = 1.0 - fVar104;
      auVar113._4_4_ = fVar112;
      auVar113._0_4_ = fVar112;
      auVar113._8_4_ = fVar112;
      auVar113._12_4_ = fVar112;
      auVar87._0_4_ = fVar104 * auVar56._0_4_;
      auVar87._4_4_ = fVar104 * auVar56._4_4_;
      auVar87._8_4_ = fVar104 * auVar56._8_4_;
      auVar87._12_4_ = fVar104 * auVar56._12_4_;
      auVar87 = vfmadd231ps_fma(auVar87,auVar113,auVar37);
      auVar74._0_4_ = fVar104 * auVar50._0_4_;
      auVar74._4_4_ = fVar104 * auVar50._4_4_;
      auVar74._8_4_ = fVar104 * auVar50._8_4_;
      auVar74._12_4_ = fVar104 * auVar50._12_4_;
      auVar50 = vfmadd231ps_fma(auVar74,auVar113,auVar48);
      auVar81._0_4_ = fVar104 * auVar79._0_4_;
      auVar81._4_4_ = fVar104 * auVar79._4_4_;
      auVar81._8_4_ = fVar104 * auVar79._8_4_;
      auVar81._12_4_ = fVar104 * auVar79._12_4_;
      auVar79 = vfmadd231ps_fma(auVar81,auVar113,auVar36);
      auVar92._0_4_ = fVar104 * auVar44._0_4_;
      auVar92._4_4_ = fVar104 * auVar44._4_4_;
      auVar92._8_4_ = fVar104 * auVar44._8_4_;
      auVar92._12_4_ = fVar104 * auVar44._12_4_;
      auVar62 = vfmadd231ps_fma(auVar92,auVar113,auVar62);
      auVar61._0_4_ = fVar104 * auVar59._0_4_;
      auVar61._4_4_ = fVar104 * auVar59._4_4_;
      auVar61._8_4_ = fVar104 * auVar59._8_4_;
      auVar61._12_4_ = fVar104 * auVar59._12_4_;
      auVar59 = vfmadd231ps_fma(auVar61,auVar113,auVar42);
      puVar1 = (undefined8 *)(uVar16 + 0x30 + lVar24);
      local_1488 = *puVar1;
      uStack_1480 = puVar1[1];
      puVar1 = (undefined8 *)(uVar16 + 0x40 + lVar24);
      auVar42._0_4_ = fVar104 * auVar43._0_4_;
      auVar42._4_4_ = fVar104 * auVar43._4_4_;
      auVar42._8_4_ = fVar104 * auVar43._8_4_;
      auVar42._12_4_ = fVar104 * auVar43._12_4_;
      auVar45 = vfmadd231ps_fma(auVar42,auVar113,auVar45);
      auVar48._0_4_ = fVar104 * auVar60._0_4_;
      auVar48._4_4_ = fVar104 * auVar60._4_4_;
      auVar48._8_4_ = fVar104 * auVar60._8_4_;
      auVar48._12_4_ = fVar104 * auVar60._12_4_;
      auVar56._0_4_ = fVar104 * auVar64._0_4_;
      auVar56._4_4_ = fVar104 * auVar64._4_4_;
      auVar56._8_4_ = fVar104 * auVar64._8_4_;
      auVar56._12_4_ = fVar104 * auVar64._12_4_;
      auVar68._0_4_ = fVar104 * auVar35._0_4_;
      auVar68._4_4_ = fVar104 * auVar35._4_4_;
      auVar68._8_4_ = fVar104 * auVar35._8_4_;
      auVar68._12_4_ = fVar104 * auVar35._12_4_;
      auVar60 = vfmadd231ps_fma(auVar48,auVar113,auVar38);
      auVar56 = vfmadd231ps_fma(auVar56,auVar113,auVar51);
      auVar72 = vfmadd231ps_fma(auVar68,auVar113,auVar72);
      local_1498 = *puVar1;
      uStack_1490 = puVar1[1];
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar36._4_4_ = uVar2;
      auVar36._0_4_ = uVar2;
      auVar36._8_4_ = uVar2;
      auVar36._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar105._4_4_ = uVar2;
      auVar105._0_4_ = uVar2;
      auVar105._8_4_ = uVar2;
      auVar105._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar122._4_4_ = uVar2;
      auVar122._0_4_ = uVar2;
      auVar122._8_4_ = uVar2;
      auVar122._12_4_ = uVar2;
      auVar42 = vsubps_avx(auVar87,auVar36);
      auVar48 = vsubps_avx(auVar50,auVar105);
      auVar64 = vsubps_avx(auVar79,auVar122);
      auVar35 = vsubps_avx(auVar62,auVar36);
      auVar50 = vsubps_avx(auVar59,auVar105);
      auVar51 = vsubps_avx(auVar45,auVar122);
      auVar59 = vsubps_avx(auVar60,auVar36);
      auVar60 = vsubps_avx(auVar56,auVar105);
      auVar45 = vsubps_avx(auVar72,auVar122);
      auVar72 = vsubps_avx(auVar59,auVar42);
      auVar79 = vsubps_avx(auVar60,auVar48);
      auVar87 = vsubps_avx(auVar45,auVar64);
      auVar37._0_4_ = auVar42._0_4_ + auVar59._0_4_;
      auVar37._4_4_ = auVar42._4_4_ + auVar59._4_4_;
      auVar37._8_4_ = auVar42._8_4_ + auVar59._8_4_;
      auVar37._12_4_ = auVar42._12_4_ + auVar59._12_4_;
      auVar57._0_4_ = auVar60._0_4_ + auVar48._0_4_;
      auVar57._4_4_ = auVar60._4_4_ + auVar48._4_4_;
      auVar57._8_4_ = auVar60._8_4_ + auVar48._8_4_;
      auVar57._12_4_ = auVar60._12_4_ + auVar48._12_4_;
      fVar112 = auVar64._0_4_;
      auVar62._0_4_ = auVar45._0_4_ + fVar112;
      fVar120 = auVar64._4_4_;
      auVar62._4_4_ = auVar45._4_4_ + fVar120;
      fVar86 = auVar64._8_4_;
      auVar62._8_4_ = auVar45._8_4_ + fVar86;
      fVar91 = auVar64._12_4_;
      auVar62._12_4_ = auVar45._12_4_ + fVar91;
      auVar123._0_4_ = auVar87._0_4_ * auVar57._0_4_;
      auVar123._4_4_ = auVar87._4_4_ * auVar57._4_4_;
      auVar123._8_4_ = auVar87._8_4_ * auVar57._8_4_;
      auVar123._12_4_ = auVar87._12_4_ * auVar57._12_4_;
      auVar56 = vfmsub231ps_fma(auVar123,auVar79,auVar62);
      auVar63._0_4_ = auVar72._0_4_ * auVar62._0_4_;
      auVar63._4_4_ = auVar72._4_4_ * auVar62._4_4_;
      auVar63._8_4_ = auVar72._8_4_ * auVar62._8_4_;
      auVar63._12_4_ = auVar72._12_4_ * auVar62._12_4_;
      auVar62 = vfmsub231ps_fma(auVar63,auVar87,auVar37);
      auVar38._0_4_ = auVar79._0_4_ * auVar37._0_4_;
      auVar38._4_4_ = auVar79._4_4_ * auVar37._4_4_;
      auVar38._8_4_ = auVar79._8_4_ * auVar37._8_4_;
      auVar38._12_4_ = auVar79._12_4_ * auVar37._12_4_;
      auVar36 = vfmsub231ps_fma(auVar38,auVar72,auVar57);
      fVar104 = *(float *)(ray + k * 4 + 0x60);
      auVar58._0_4_ = fVar104 * auVar36._0_4_;
      auVar58._4_4_ = fVar104 * auVar36._4_4_;
      auVar58._8_4_ = fVar104 * auVar36._8_4_;
      auVar58._12_4_ = fVar104 * auVar36._12_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar138._4_4_ = uVar2;
      auVar138._0_4_ = uVar2;
      auVar138._8_4_ = uVar2;
      auVar138._12_4_ = uVar2;
      auVar62 = vfmadd231ps_fma(auVar58,auVar138,auVar62);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar93._4_4_ = uVar2;
      auVar93._0_4_ = uVar2;
      auVar93._8_4_ = uVar2;
      auVar93._12_4_ = uVar2;
      auVar38 = vfmadd231ps_fma(auVar62,auVar93,auVar56);
      auVar62 = vsubps_avx(auVar48,auVar50);
      auVar56 = vsubps_avx(auVar64,auVar51);
      auVar43._0_4_ = auVar48._0_4_ + auVar50._0_4_;
      auVar43._4_4_ = auVar48._4_4_ + auVar50._4_4_;
      auVar43._8_4_ = auVar48._8_4_ + auVar50._8_4_;
      auVar43._12_4_ = auVar48._12_4_ + auVar50._12_4_;
      auVar64._0_4_ = auVar51._0_4_ + fVar112;
      auVar64._4_4_ = auVar51._4_4_ + fVar120;
      auVar64._8_4_ = auVar51._8_4_ + fVar86;
      auVar64._12_4_ = auVar51._12_4_ + fVar91;
      fVar97 = auVar56._0_4_;
      auVar75._0_4_ = auVar43._0_4_ * fVar97;
      fVar88 = auVar56._4_4_;
      auVar75._4_4_ = auVar43._4_4_ * fVar88;
      fVar89 = auVar56._8_4_;
      auVar75._8_4_ = auVar43._8_4_ * fVar89;
      fVar90 = auVar56._12_4_;
      auVar75._12_4_ = auVar43._12_4_ * fVar90;
      auVar37 = vfmsub231ps_fma(auVar75,auVar62,auVar64);
      auVar36 = vsubps_avx(auVar42,auVar35);
      fVar121 = auVar36._0_4_;
      auVar82._0_4_ = fVar121 * auVar64._0_4_;
      fVar125 = auVar36._4_4_;
      auVar82._4_4_ = fVar125 * auVar64._4_4_;
      fVar127 = auVar36._8_4_;
      auVar82._8_4_ = fVar127 * auVar64._8_4_;
      fVar129 = auVar36._12_4_;
      auVar82._12_4_ = fVar129 * auVar64._12_4_;
      auVar65._0_4_ = auVar42._0_4_ + auVar35._0_4_;
      auVar65._4_4_ = auVar42._4_4_ + auVar35._4_4_;
      auVar65._8_4_ = auVar42._8_4_ + auVar35._8_4_;
      auVar65._12_4_ = auVar42._12_4_ + auVar35._12_4_;
      auVar64 = vfmsub231ps_fma(auVar82,auVar56,auVar65);
      fVar133 = auVar62._0_4_;
      auVar66._0_4_ = fVar133 * auVar65._0_4_;
      fVar135 = auVar62._4_4_;
      auVar66._4_4_ = fVar135 * auVar65._4_4_;
      fVar136 = auVar62._8_4_;
      auVar66._8_4_ = fVar136 * auVar65._8_4_;
      fVar137 = auVar62._12_4_;
      auVar66._12_4_ = fVar137 * auVar65._12_4_;
      auVar43 = vfmsub231ps_fma(auVar66,auVar36,auVar43);
      auVar67._0_4_ = fVar104 * auVar43._0_4_;
      auVar67._4_4_ = fVar104 * auVar43._4_4_;
      auVar67._8_4_ = fVar104 * auVar43._8_4_;
      auVar67._12_4_ = fVar104 * auVar43._12_4_;
      auVar64 = vfmadd231ps_fma(auVar67,auVar138,auVar64);
      local_1468 = vfmadd231ps_fma(auVar64,auVar93,auVar37);
      auVar37 = vsubps_avx(auVar35,auVar59);
      auVar49._0_4_ = auVar35._0_4_ + auVar59._0_4_;
      auVar49._4_4_ = auVar35._4_4_ + auVar59._4_4_;
      auVar49._8_4_ = auVar35._8_4_ + auVar59._8_4_;
      auVar49._12_4_ = auVar35._12_4_ + auVar59._12_4_;
      auVar59 = vsubps_avx(auVar50,auVar60);
      auVar44._0_4_ = auVar60._0_4_ + auVar50._0_4_;
      auVar44._4_4_ = auVar60._4_4_ + auVar50._4_4_;
      auVar44._8_4_ = auVar60._8_4_ + auVar50._8_4_;
      auVar44._12_4_ = auVar60._12_4_ + auVar50._12_4_;
      auVar60 = vsubps_avx(auVar51,auVar45);
      auVar69._0_4_ = auVar51._0_4_ + auVar45._0_4_;
      auVar69._4_4_ = auVar51._4_4_ + auVar45._4_4_;
      auVar69._8_4_ = auVar51._8_4_ + auVar45._8_4_;
      auVar69._12_4_ = auVar51._12_4_ + auVar45._12_4_;
      auVar35._0_4_ = auVar60._0_4_ * auVar44._0_4_;
      auVar35._4_4_ = auVar60._4_4_ * auVar44._4_4_;
      auVar35._8_4_ = auVar60._8_4_ * auVar44._8_4_;
      auVar35._12_4_ = auVar60._12_4_ * auVar44._12_4_;
      auVar35 = vfmsub231ps_fma(auVar35,auVar59,auVar69);
      auVar70._0_4_ = auVar69._0_4_ * auVar37._0_4_;
      auVar70._4_4_ = auVar69._4_4_ * auVar37._4_4_;
      auVar70._8_4_ = auVar69._8_4_ * auVar37._8_4_;
      auVar70._12_4_ = auVar69._12_4_ * auVar37._12_4_;
      auVar64 = vfmsub231ps_fma(auVar70,auVar60,auVar49);
      auVar50._0_4_ = auVar59._0_4_ * auVar49._0_4_;
      auVar50._4_4_ = auVar59._4_4_ * auVar49._4_4_;
      auVar50._8_4_ = auVar59._8_4_ * auVar49._8_4_;
      auVar50._12_4_ = auVar59._12_4_ * auVar49._12_4_;
      auVar50 = vfmsub231ps_fma(auVar50,auVar37,auVar44);
      auVar51._0_4_ = fVar104 * auVar50._0_4_;
      auVar51._4_4_ = fVar104 * auVar50._4_4_;
      auVar51._8_4_ = fVar104 * auVar50._8_4_;
      auVar51._12_4_ = fVar104 * auVar50._12_4_;
      auVar64 = vfmadd231ps_fma(auVar51,auVar138,auVar64);
      auVar51 = vfmadd231ps_fma(auVar64,auVar93,auVar35);
      local_1478 = auVar38._0_4_;
      fStack_1474 = auVar38._4_4_;
      fStack_1470 = auVar38._8_4_;
      fStack_146c = auVar38._12_4_;
      local_1458._0_4_ = auVar51._0_4_ + local_1478 + local_1468._0_4_;
      local_1458._4_4_ = auVar51._4_4_ + fStack_1474 + local_1468._4_4_;
      local_1458._8_4_ = auVar51._8_4_ + fStack_1470 + local_1468._8_4_;
      local_1458._12_4_ = auVar51._12_4_ + fStack_146c + local_1468._12_4_;
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar64 = vminps_avx(auVar38,local_1468);
      auVar35 = vminps_avx(auVar64,auVar51);
      auVar64 = vandps_avx(local_1458,auVar45);
      auVar83._0_4_ = auVar64._0_4_ * 1.1920929e-07;
      auVar83._4_4_ = auVar64._4_4_ * 1.1920929e-07;
      auVar83._8_4_ = auVar64._8_4_ * 1.1920929e-07;
      auVar83._12_4_ = auVar64._12_4_ * 1.1920929e-07;
      uVar27 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
      auVar76._0_8_ = uVar27 ^ 0x8000000080000000;
      auVar76._8_4_ = -auVar83._8_4_;
      auVar76._12_4_ = -auVar83._12_4_;
      auVar35 = vcmpps_avx(auVar35,auVar76,5);
      auVar50 = vmaxps_avx(auVar38,local_1468);
      auVar50 = vmaxps_avx(auVar50,auVar51);
      auVar50 = vcmpps_avx(auVar50,auVar83,2);
      auVar35 = vorps_avx(auVar35,auVar50);
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        auVar52._0_4_ = fVar133 * auVar87._0_4_;
        auVar52._4_4_ = fVar135 * auVar87._4_4_;
        auVar52._8_4_ = fVar136 * auVar87._8_4_;
        auVar52._12_4_ = fVar137 * auVar87._12_4_;
        auVar71._0_4_ = auVar79._0_4_ * fVar121;
        auVar71._4_4_ = auVar79._4_4_ * fVar125;
        auVar71._8_4_ = auVar79._8_4_ * fVar127;
        auVar71._12_4_ = auVar79._12_4_ * fVar129;
        auVar79 = vfmsub213ps_fma(auVar79,auVar56,auVar52);
        auVar77._0_4_ = auVar59._0_4_ * fVar97;
        auVar77._4_4_ = auVar59._4_4_ * fVar88;
        auVar77._8_4_ = auVar59._8_4_ * fVar89;
        auVar77._12_4_ = auVar59._12_4_ * fVar90;
        auVar84._0_4_ = auVar60._0_4_ * fVar121;
        auVar84._4_4_ = auVar60._4_4_ * fVar125;
        auVar84._8_4_ = auVar60._8_4_ * fVar127;
        auVar84._12_4_ = auVar60._12_4_ * fVar129;
        auVar60 = vfmsub213ps_fma(auVar60,auVar62,auVar77);
        auVar50 = vandps_avx(auVar52,auVar45);
        auVar51 = vandps_avx(auVar77,auVar45);
        auVar50 = vcmpps_avx(auVar50,auVar51,1);
        local_13f8 = vblendvps_avx(auVar60,auVar79,auVar50);
        auVar78._0_4_ = fVar133 * auVar37._0_4_;
        auVar78._4_4_ = fVar135 * auVar37._4_4_;
        auVar78._8_4_ = fVar136 * auVar37._8_4_;
        auVar78._12_4_ = fVar137 * auVar37._12_4_;
        auVar60 = vfmsub213ps_fma(auVar37,auVar56,auVar84);
        auVar53._0_4_ = auVar72._0_4_ * fVar97;
        auVar53._4_4_ = auVar72._4_4_ * fVar88;
        auVar53._8_4_ = auVar72._8_4_ * fVar89;
        auVar53._12_4_ = auVar72._12_4_ * fVar90;
        auVar79 = vfmsub213ps_fma(auVar87,auVar36,auVar53);
        auVar50 = vandps_avx(auVar53,auVar45);
        auVar51 = vandps_avx(auVar84,auVar45);
        auVar50 = vcmpps_avx(auVar50,auVar51,1);
        local_13e8 = vblendvps_avx(auVar60,auVar79,auVar50);
        auVar60 = vfmsub213ps_fma(auVar72,auVar62,auVar71);
        auVar59 = vfmsub213ps_fma(auVar59,auVar36,auVar78);
        auVar50 = vandps_avx(auVar71,auVar45);
        auVar51 = vandps_avx(auVar78,auVar45);
        auVar50 = vcmpps_avx(auVar50,auVar51,1);
        local_13d8 = vblendvps_avx(auVar59,auVar60,auVar50);
        auVar59._0_4_ = local_13d8._0_4_ * fVar104;
        auVar59._4_4_ = local_13d8._4_4_ * fVar104;
        auVar59._8_4_ = local_13d8._8_4_ * fVar104;
        auVar59._12_4_ = local_13d8._12_4_ * fVar104;
        auVar50 = vfmadd213ps_fma(auVar138,local_13e8,auVar59);
        auVar50 = vfmadd213ps_fma(auVar93,local_13f8,auVar50);
        auVar72._0_4_ = auVar50._0_4_ + auVar50._0_4_;
        auVar72._4_4_ = auVar50._4_4_ + auVar50._4_4_;
        auVar72._8_4_ = auVar50._8_4_ + auVar50._8_4_;
        auVar72._12_4_ = auVar50._12_4_ + auVar50._12_4_;
        auVar60._0_4_ = local_13d8._0_4_ * fVar112;
        auVar60._4_4_ = local_13d8._4_4_ * fVar120;
        auVar60._8_4_ = local_13d8._8_4_ * fVar86;
        auVar60._12_4_ = local_13d8._12_4_ * fVar91;
        auVar50 = vfmadd213ps_fma(auVar48,local_13e8,auVar60);
        auVar42 = vfmadd213ps_fma(auVar42,local_13f8,auVar50);
        auVar50 = vrcpps_avx(auVar72);
        auVar94._8_4_ = 0x3f800000;
        auVar94._0_8_ = 0x3f8000003f800000;
        auVar94._12_4_ = 0x3f800000;
        auVar48 = vfnmadd213ps_fma(auVar50,auVar72,auVar94);
        auVar50 = vfmadd132ps_fma(auVar48,auVar50,auVar50);
        local_1408._0_4_ = (auVar42._0_4_ + auVar42._0_4_) * auVar50._0_4_;
        local_1408._4_4_ = (auVar42._4_4_ + auVar42._4_4_) * auVar50._4_4_;
        local_1408._8_4_ = (auVar42._8_4_ + auVar42._8_4_) * auVar50._8_4_;
        local_1408._12_4_ = (auVar42._12_4_ + auVar42._12_4_) * auVar50._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar79._4_4_ = uVar2;
        auVar79._0_4_ = uVar2;
        auVar79._8_4_ = uVar2;
        auVar79._12_4_ = uVar2;
        auVar50 = vcmpps_avx(auVar79,local_1408,2);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar95._4_4_ = uVar2;
        auVar95._0_4_ = uVar2;
        auVar95._8_4_ = uVar2;
        auVar95._12_4_ = uVar2;
        auVar73 = ZEXT1664(auVar95);
        auVar42 = vcmpps_avx(local_1408,auVar95,2);
        auVar50 = vandps_avx(auVar50,auVar42);
        auVar42 = auVar35 & auVar50;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar42[0xf] < '\0') {
          auVar35 = vandps_avx(auVar50,auVar35);
          auVar50 = vcmpps_avx(auVar72,_DAT_01f45a50,4);
          local_1438 = vandps_avx(auVar35,auVar50);
          uVar17 = vmovmskps_avx(local_1438);
          if (uVar17 != 0) {
            local_1448 = &mapUV;
            auVar35 = vrcpps_avx(local_1458);
            auVar54._8_4_ = 0x3f800000;
            auVar54._0_8_ = 0x3f8000003f800000;
            auVar54._12_4_ = 0x3f800000;
            auVar50 = vfnmadd213ps_fma(local_1458,auVar35,auVar54);
            auVar35 = vfmadd132ps_fma(auVar50,auVar35,auVar35);
            auVar46._8_4_ = 0x219392ef;
            auVar46._0_8_ = 0x219392ef219392ef;
            auVar46._12_4_ = 0x219392ef;
            auVar64 = vcmpps_avx(auVar64,auVar46,5);
            auVar64 = vandps_avx(auVar35,auVar64);
            auVar39._0_4_ = local_1478 * auVar64._0_4_;
            auVar39._4_4_ = fStack_1474 * auVar64._4_4_;
            auVar39._8_4_ = fStack_1470 * auVar64._8_4_;
            auVar39._12_4_ = fStack_146c * auVar64._12_4_;
            local_1428 = vminps_avx(auVar39,auVar54);
            auVar40._0_4_ = auVar64._0_4_ * local_1468._0_4_;
            auVar40._4_4_ = auVar64._4_4_ * local_1468._4_4_;
            auVar40._8_4_ = auVar64._8_4_ * local_1468._8_4_;
            auVar40._12_4_ = auVar64._12_4_ * local_1468._12_4_;
            local_1418 = vminps_avx(auVar40,auVar54);
            uVar27 = (ulong)(uVar17 & 0xff);
            do {
              uVar18 = 0;
              for (uVar20 = uVar27; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                uVar18 = uVar18 + 1;
              }
              uVar17 = *(uint *)((long)&local_1488 + uVar18 * 4);
              pGVar5 = (scene->geometries).items[uVar17].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar20 = (ulong)(uint)((int)uVar18 * 4);
                  local_1398 = *(undefined4 *)(local_1428 + uVar20);
                  uVar2 = *(undefined4 *)(local_1418 + uVar20);
                  local_1388._4_4_ = uVar2;
                  local_1388._0_4_ = uVar2;
                  local_1388._8_4_ = uVar2;
                  local_1388._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar20);
                  args.context = context->user;
                  local_1368._4_4_ = uVar17;
                  local_1368._0_4_ = uVar17;
                  local_1368._8_4_ = uVar17;
                  local_1368._12_4_ = uVar17;
                  uVar2 = *(undefined4 *)((long)&local_1498 + uVar20);
                  local_1378._4_4_ = uVar2;
                  local_1378._0_4_ = uVar2;
                  local_1378._8_4_ = uVar2;
                  local_1378._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_13f8 + uVar20);
                  uVar4 = *(undefined4 *)(local_13e8 + uVar20);
                  local_13b8._4_4_ = uVar4;
                  local_13b8._0_4_ = uVar4;
                  local_13b8._8_4_ = uVar4;
                  local_13b8._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_13d8 + uVar20);
                  local_13a8._4_4_ = uVar4;
                  local_13a8._0_4_ = uVar4;
                  local_13a8._8_4_ = uVar4;
                  local_13a8._12_4_ = uVar4;
                  local_13c8[0] = (RTCHitN)(char)uVar2;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar2;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar2;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar2;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1528 = *local_1510;
                  args.valid = (int *)local_1528;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar64 = auVar73._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                    auVar73 = ZEXT1664(auVar64);
                  }
                  if (local_1528 == (undefined1  [16])0x0) {
                    auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar64 = auVar64 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                      auVar73 = ZEXT1664(auVar64);
                    }
                    auVar35 = vpcmpeqd_avx(local_1528,_DAT_01f45a50);
                    auVar64 = auVar35 ^ _DAT_01f46b70;
                    auVar55._8_4_ = 0xff800000;
                    auVar55._0_8_ = 0xff800000ff800000;
                    auVar55._12_4_ = 0xff800000;
                    auVar35 = vblendvps_avx(auVar55,*(undefined1 (*) [16])(args.ray + 0x80),auVar35)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar35;
                  }
                  auVar47._8_8_ = 0x100000001;
                  auVar47._0_8_ = 0x100000001;
                  if ((auVar47 & auVar64) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar73._0_4_;
                    goto LAB_016680a9;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_016681a3;
              }
LAB_016680a9:
              uVar27 = uVar27 ^ 1L << (uVar18 & 0x3f);
            } while (uVar27 != 0);
          }
        }
      }
      auVar73 = ZEXT3264(local_11f8);
      auVar80 = ZEXT3264(local_1218);
      auVar85 = ZEXT3264(local_1238);
      auVar134 = ZEXT3264(local_1318);
      auVar139 = ZEXT3264(local_1338);
      uVar27 = local_1508;
      fVar86 = local_1258;
      fVar88 = fStack_1254;
      fVar89 = fStack_1250;
      fVar90 = fStack_124c;
      fVar121 = fStack_1248;
      fVar125 = fStack_1244;
      fVar127 = fStack_1240;
      fVar91 = local_1278;
      fVar129 = fStack_1274;
      fVar133 = fStack_1270;
      fVar135 = fStack_126c;
      fVar136 = fStack_1268;
      fVar137 = fStack_1264;
      fVar96 = fStack_1260;
      fVar97 = local_1298;
      fVar98 = fStack_1294;
      fVar99 = fStack_1290;
      fVar100 = fStack_128c;
      fVar101 = fStack_1288;
      fVar102 = fStack_1284;
      fVar103 = fStack_1280;
      fVar104 = local_12b8;
      fVar106 = fStack_12b4;
      fVar107 = fStack_12b0;
      fVar108 = fStack_12ac;
      fVar109 = fStack_12a8;
      fVar110 = fStack_12a4;
      fVar111 = fStack_12a0;
      fVar112 = local_12d8;
      fVar114 = fStack_12d4;
      fVar115 = fStack_12d0;
      fVar116 = fStack_12cc;
      fVar117 = fStack_12c8;
      fVar118 = fStack_12c4;
      fVar119 = fStack_12c0;
      fVar120 = local_12f8;
      fVar124 = fStack_12f4;
      fVar126 = fStack_12f0;
      fVar128 = fStack_12ec;
      fVar130 = fStack_12e8;
      fVar131 = fStack_12e4;
      fVar132 = fStack_12e0;
    }
LAB_01668178:
    local_15f0 = local_15f8;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }